

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::Configure(cmake *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  *this_00;
  mapped_type mVar1;
  cmState *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  bool b;
  bool b_00;
  allocator local_49;
  key_type local_48;
  
  std::__cxx11::string::string((string *)&local_48,"deprecated",&local_49);
  this_00 = &this->DiagLevels;
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (sVar6 == 1) {
    std::__cxx11::string::string((string *)&local_48,"deprecated",&local_49);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](this_00,&local_48);
    mVar1 = *pmVar7;
    std::__cxx11::string::~string((string *)&local_48);
    if (mVar1 < (DIAG_ERROR|DIAG_WARN)) {
      bVar10 = (byte)mVar1 & 7;
      SetSuppressDeprecatedWarnings(this,(bool)(1 >> bVar10));
      SetDeprecatedWarningsAsErrors(this,(bool)(4U >> bVar10 & 1));
    }
  }
  std::__cxx11::string::string((string *)&local_48,"dev",&local_49);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (sVar6 != 1) goto LAB_002eb19f;
  pcVar2 = this->State;
  std::__cxx11::string::string((string *)&local_48,"CMAKE_WARN_DEPRECATED",&local_49);
  pcVar8 = cmState::GetCacheEntryValue(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pcVar2 = this->State;
  std::__cxx11::string::string((string *)&local_48,"CMAKE_ERROR_DEPRECATED",&local_49);
  pcVar9 = cmState::GetCacheEntryValue(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar3 = pcVar8 != (char *)0x0;
  bVar4 = pcVar9 != (char *)0x0;
  std::__cxx11::string::string((string *)&local_48,"dev",&local_49);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
           ::operator[](this_00,&local_48);
  mVar1 = *pmVar7;
  std::__cxx11::string::~string((string *)&local_48);
  if (mVar1 == DIAG_ERROR) {
    b = false;
    SetSuppressDevWarnings(this,false);
    SetDevWarningsAsErrors(this,true);
    if (bVar3 || bVar4) goto LAB_002eb19f;
    b_00 = true;
  }
  else if (mVar1 == DIAG_WARN) {
    b = false;
    SetSuppressDevWarnings(this,false);
    SetDevWarningsAsErrors(this,false);
    b_00 = false;
    if (bVar3 || bVar4) goto LAB_002eb19f;
  }
  else {
    if (mVar1 != DIAG_IGNORE) goto LAB_002eb19f;
    SetSuppressDevWarnings(this,true);
    b_00 = false;
    SetDevWarningsAsErrors(this,false);
    if (bVar3 || bVar4) goto LAB_002eb19f;
    b = true;
  }
  SetSuppressDeprecatedWarnings(this,b);
  SetDeprecatedWarningsAsErrors(this,b_00);
LAB_002eb19f:
  iVar5 = ActualConfigure(this);
  pcVar2 = this->State;
  std::__cxx11::string::string((string *)&local_48,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_49);
  pcVar8 = cmState::GetGlobalProperty(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
    std::__cxx11::string::string((string *)&local_48,pcVar8,&local_49);
    iVar5 = HandleDeleteCacheVariables(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return iVar5;
}

Assistant:

int cmake::Configure()
{
  DiagLevel diagLevel;

  if (this->DiagLevels.count("deprecated") == 1) {

    diagLevel = this->DiagLevels["deprecated"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDeprecatedWarnings(true);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(true);
    }
  }

  if (this->DiagLevels.count("dev") == 1) {
    bool setDeprecatedVariables = false;

    const char* cachedWarnDeprecated =
      this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
    const char* cachedErrorDeprecated =
      this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");

    // don't overwrite deprecated warning setting from a previous invocation
    if (!cachedWarnDeprecated && !cachedErrorDeprecated) {
      setDeprecatedVariables = true;
    }

    diagLevel = this->DiagLevels["dev"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDevWarnings(true);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(true);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(true);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(true);
      }
    }
  }

  int ret = this->ActualConfigure();
  const char* delCacheVars =
    this->State->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if (delCacheVars && delCacheVars[0] != 0) {
    return this->HandleDeleteCacheVariables(delCacheVars);
  }
  return ret;
}